

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O3

EStatusCode __thiscall
PDFHummus::DocumentContext::WriteTrailerDictionaryValues
          (DocumentContext *this,DictionaryContext *inDictionaryContext)

{
  TrailerInformation *this_00;
  string *inString;
  IndirectObjectsReferenceRegistry *this_01;
  ObjectIDType inValue;
  Trace *this_02;
  EStatusCode EVar1;
  string *inString_00;
  BoolAndLongFilePositionType BVar2;
  BoolAndObjectReference objectIDResult;
  string local_68;
  char local_48;
  ObjectReference local_40;
  
  DictionaryContext::WriteKey(inDictionaryContext,&scSize_abi_cxx11_);
  this_01 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  inValue = IndirectObjectsReferenceRegistry::GetObjectsCount(this_01);
  DictionaryContext::WriteIntegerValue(inDictionaryContext,inValue);
  this_00 = &this->mTrailerInformation;
  BVar2 = TrailerInformation::GetPrev(this_00);
  if (((undefined1  [16])BVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    DictionaryContext::WriteKey(inDictionaryContext,&scPrev_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(inDictionaryContext,BVar2.second);
  }
  TrailerInformation::GetRoot(this_00);
  if (local_48 == '\x01') {
    DictionaryContext::WriteKey(inDictionaryContext,&scRoot_abi_cxx11_);
    DictionaryContext::WriteObjectReferenceValue(inDictionaryContext,&local_40);
    TrailerInformation::GetEncrypt(this_00);
    local_48 = (char)local_68._M_dataplus._M_p;
    local_40.ObjectID = local_68._M_string_length;
    local_40.GenerationNumber = local_68.field_2._M_allocated_capacity;
    if ((char)local_68._M_dataplus._M_p != '\0') {
      DictionaryContext::WriteKey(inDictionaryContext,&scEncrypt_abi_cxx11_);
      DictionaryContext::WriteObjectReferenceValue(inDictionaryContext,&local_40);
    }
    TrailerInformation::GetInfoDictionaryReference(this_00);
    local_48 = (char)local_68._M_dataplus._M_p;
    local_40.ObjectID = local_68._M_string_length;
    local_40.GenerationNumber = local_68.field_2._M_allocated_capacity;
    if ((char)local_68._M_dataplus._M_p == '\x01') {
      DictionaryContext::WriteKey(inDictionaryContext,&scInfo_abi_cxx11_);
      DictionaryContext::WriteObjectReferenceValue(inDictionaryContext,&local_40);
    }
    EncryptionHelper::PauseEncryption(&this->mEncryptionHelper);
    inString = &this->mNewPDFID;
    if ((this->mNewPDFID)._M_string_length == 0) {
      GenerateMD5IDForFile_abi_cxx11_(&local_68,this);
      std::__cxx11::string::operator=((string *)inString,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p) !=
          &local_68.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p),
                        local_68.field_2._M_allocated_capacity + 1);
      }
    }
    DictionaryContext::WriteKey(inDictionaryContext,&scID_abi_cxx11_);
    ObjectsContext::StartArray(this->mObjectsContext);
    inString_00 = &this->mModifiedDocumentID;
    if (this->mModifiedDocumentIDExists == false) {
      inString_00 = inString;
    }
    EVar1 = eSuccess;
    ObjectsContext::WriteHexString(this->mObjectsContext,inString_00,eTokenSeparatorSpace);
    ObjectsContext::WriteHexString(this->mObjectsContext,inString,eTokenSeparatorSpace);
    ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorNone);
    ObjectsContext::EndLine(this->mObjectsContext);
    EncryptionHelper::ReleaseEncryption(&this->mEncryptionHelper);
  }
  else {
    this_02 = Trace::DefaultTrace();
    Trace::TraceToLog(this_02,
                      "DocumentContext::WriteTrailerDictionaryValues, Unexpected Failure. Didn\'t find catalog object while writing trailer"
                     );
    EVar1 = eFailure;
  }
  return EVar1;
}

Assistant:

EStatusCode DocumentContext::WriteTrailerDictionaryValues(DictionaryContext* inDictionaryContext)
{
    EStatusCode status = eSuccess;

	do
	{

		// size
		inDictionaryContext->WriteKey(scSize);
		inDictionaryContext->WriteIntegerValue(mObjectsContext->GetInDirectObjectsRegistry().GetObjectsCount());

		// prev reference
		BoolAndLongFilePositionType filePositionResult = mTrailerInformation.GetPrev();
		if(filePositionResult.first)
		{
			inDictionaryContext->WriteKey(scPrev);
			inDictionaryContext->WriteIntegerValue(filePositionResult.second);
		}

		// catalog reference
		BoolAndObjectReference objectIDResult = mTrailerInformation.GetRoot();
		if(objectIDResult.first)
		{
			inDictionaryContext->WriteKey(scRoot);
			inDictionaryContext->WriteObjectReferenceValue(objectIDResult.second);
		}
		else
		{
			TRACE_LOG("DocumentContext::WriteTrailerDictionaryValues, Unexpected Failure. Didn't find catalog object while writing trailer");
			status = PDFHummus::eFailure;
			break;
		}

		// encrypt dictionary reference
		objectIDResult = mTrailerInformation.GetEncrypt();
		if(objectIDResult.first)
		{
			inDictionaryContext->WriteKey(scEncrypt);
			inDictionaryContext->WriteObjectReferenceValue(objectIDResult.second);
		}

		// info reference
		objectIDResult = mTrailerInformation.GetInfoDictionaryReference();
		if(objectIDResult.first)
		{
			inDictionaryContext->WriteKey(scInfo);
			inDictionaryContext->WriteObjectReferenceValue(objectIDResult.second);
		}

		// write ID [must be unencrypted, in encrypted documents]
		mEncryptionHelper.PauseEncryption();

		if(mNewPDFID.empty()) // new pdf id is created prior to end in case of encryption
			mNewPDFID = GenerateMD5IDForFile();
		inDictionaryContext->WriteKey(scID);
		mObjectsContext->StartArray();

        // if modified file scenario use original ID, otherwise create a new one for the document created ID
        if(mModifiedDocumentIDExists)
            mObjectsContext->WriteHexString(mModifiedDocumentID);
        else
            mObjectsContext->WriteHexString(mNewPDFID);
		mObjectsContext->WriteHexString(mNewPDFID);
		mObjectsContext->EndArray();
		mObjectsContext->EndLine();

		mEncryptionHelper.ReleaseEncryption();

	}while(false);

	return status;
}